

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFPageLabelDocumentHelper::getLabelsForPageRange
          (QPDFPageLabelDocumentHelper *this,longlong start_idx,longlong end_idx,
          longlong new_start_idx,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *new_labels)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  QPDFObjectHandle last;
  QPDFObjectHandle last_idx;
  string local_218;
  string local_1f8;
  QPDFObjectHandle local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  QPDFObjectHandle local_190;
  undefined1 local_180 [16];
  string local_170;
  string local_150 [16];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_1f8.field_2._8_8_ = new_labels;
  local_1b8._16_8_ = end_idx;
  getLabelForPage((QPDFPageLabelDocumentHelper *)&local_1f8,(longlong)this);
  bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&local_1f8);
  if (bVar3) {
    QPDFObjectHandle::newDictionary();
    sVar2 = local_1f8._M_string_length;
    local_1f8._M_string_length = local_218._M_string_length;
    local_1f8._M_dataplus._M_p = local_218._M_dataplus._M_p;
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_218._M_string_length = 0;
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2 !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"/St","");
    QPDFObjectHandle::newInteger(&local_1d8,new_start_idx + 1);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_1f8,&local_218,&local_1d8);
    if (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  lVar12 = *(long *)local_1f8.field_2._8_8_;
  lVar9 = (long)*(pointer *)(local_1f8.field_2._8_8_ + 8) - lVar12;
  uVar11 = lVar9 >> 4;
  if (1 < uVar11) {
    local_1b8._0_8_ = *(undefined8 *)(lVar12 + -0x10 + lVar9);
    local_1b8._8_8_ = *(long *)(lVar12 + -8 + lVar9);
    uVar10 = uVar11;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
        UNLOCK();
        lVar12 = *(long *)local_1f8.field_2._8_8_;
        uVar10 = (long)*(pointer *)(local_1f8.field_2._8_8_ + 8) - lVar12 >> 4;
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_)->_M_use_count + 1;
      }
    }
    if (uVar10 <= uVar11 - 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    lVar9 = (uVar11 - 2) * 0x10;
    local_1b8._24_8_ = *(undefined8 *)(lVar12 + lVar9);
    local_198 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar12 + 8 + lVar9);
    if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_198->_M_use_count = local_198->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_198->_M_use_count = local_198->_M_use_count + 1;
      }
    }
    bVar3 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_1b8 + 0x18));
    if ((bVar3) && (bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_1b8), bVar3)) {
      local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/S","");
      QPDFObjectHandle::getKey(&local_a0,&local_1f8);
      QPDFObjectHandle::unparse_abi_cxx11_(&local_218,&local_a0);
      local_190.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/S","");
      QPDFObjectHandle::getKey(&local_b0,(string *)local_1b8);
      QPDFObjectHandle::unparse_abi_cxx11_((string *)(local_180 + 0x10),&local_b0);
      if ((local_218._M_string_length == local_170._M_string_length) &&
         (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length ==
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
          (iVar4 = bcmp(local_218._M_dataplus._M_p,local_170._M_dataplus._M_p,
                        local_218._M_string_length), iVar4 == 0)))) {
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/P","");
        QPDFObjectHandle::getKey(&local_c0,&local_1f8);
        QPDFObjectHandle::unparse_abi_cxx11_(&local_50,&local_c0);
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/P","");
        QPDFObjectHandle::getKey(&local_d0,(string *)local_1b8);
        QPDFObjectHandle::unparse_abi_cxx11_(&local_70,&local_d0);
        if ((local_50._M_string_length == local_70._M_string_length) &&
           ((local_50._M_string_length == 0 ||
            (iVar4 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                          local_50._M_string_length), iVar4 == 0)))) {
          local_150._0_8_ = local_140;
          std::__cxx11::string::_M_construct<char_const*>(local_150,"/St","");
          QPDFObjectHandle::getKey(&local_e0,&local_1f8);
          bVar3 = QPDFObjectHandle::isInteger(&local_e0);
          if (bVar3) {
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/St","");
            QPDFObjectHandle::getKey(&local_f0,(string *)local_1b8);
            bVar3 = QPDFObjectHandle::isInteger(&local_f0);
            if (local_f0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
          }
          else {
            bVar3 = false;
          }
          if (local_e0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          if ((long *)local_150._0_8_ != local_140) {
            operator_delete((void *)local_150._0_8_,local_140[0] + 1);
          }
        }
        else {
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_110[0] != local_100) {
          operator_delete(local_110[0],local_100[0] + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_190.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_180) {
        operator_delete(local_190.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (ulong)(local_180._0_8_ + 1));
      }
      paVar1 = &local_218.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_1c8) {
        operator_delete(local_1d8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_1c8._0_8_ + 1);
      }
      if (bVar3 != false) {
        local_218._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"/St","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_180 + 0x10),&local_1f8);
        lVar5 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)(local_180 + 0x10));
        local_1d8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/St","");
        QPDFObjectHandle::getKey(&local_190,(string *)local_1b8);
        lVar6 = QPDFObjectHandle::getIntValue(&local_190);
        if (local_190.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_190.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if (local_1d8.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_1c8) {
          operator_delete(local_1d8.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_1c8._0_8_ + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar1) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        lVar7 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)(local_1b8 + 0x18));
        if (lVar5 - lVar6 == new_start_idx - lVar7) {
          if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          goto LAB_001d66c6;
        }
      }
    }
    if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
  }
  QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_218,new_start_idx);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::emplace_back<QPDFObjectHandle>
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1f8.field_2._8_8_,
             (QPDFObjectHandle *)&local_218);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1f8.field_2._8_8_,
             (value_type *)&local_1f8);
LAB_001d66c6:
  if (start_idx < (long)local_1b8._16_8_) {
    local_1b8._16_8_ = -local_1b8._16_8_;
    lVar12 = start_idx + 1;
    lVar9 = new_start_idx + 1;
    do {
      bVar3 = QPDFNumberTreeObjectHelper::hasIndex
                        ((((this->m).
                           super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->labels).
                         super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,lVar12);
      if (bVar3) {
        getLabelForPage((QPDFPageLabelDocumentHelper *)&local_218,(longlong)this);
        sVar2 = local_1f8._M_string_length;
        local_1f8._M_string_length = local_218._M_string_length;
        local_1f8._M_dataplus._M_p = local_218._M_dataplus._M_p;
        local_218._M_dataplus._M_p = (pointer)0x0;
        local_218._M_string_length = 0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2);
        }
        bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_1f8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
        }
        if (bVar3) {
          QPDFObjectHandle::newInteger((QPDFObjectHandle *)&local_218,lVar9);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     local_1f8.field_2._8_8_,(QPDFObjectHandle *)&local_218);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
          }
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     local_1f8.field_2._8_8_,(value_type *)&local_1f8);
        }
      }
      lVar8 = local_1b8._16_8_ + lVar12;
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 1;
    } while (lVar8 != 0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
  }
  return;
}

Assistant:

void
QPDFPageLabelDocumentHelper::getLabelsForPageRange(
    long long start_idx,
    long long end_idx,
    long long new_start_idx,
    std::vector<QPDFObjectHandle>& new_labels)
{
    // Start off with a suitable label for the first page. For every remaining page, if that page
    // has an explicit entry, copy it. Otherwise, let the subsequent page just sequence from the
    // prior entry. If there is no entry for the first page, fabricate one that would match how the
    // page would look in a new file in which it also didn't have an explicit label.
    QPDFObjectHandle label = getLabelForPage(start_idx);
    if (label.isNull()) {
        label = QPDFObjectHandle::newDictionary();
        label.replaceKey("/St", QPDFObjectHandle::newInteger(1 + new_start_idx));
    }
    // See if the new label is redundant based on the previous entry in the vector. If so, don't add
    // it.
    size_t size = new_labels.size();
    bool skip_first = false;
    if (size >= 2) {
        QPDFObjectHandle last = new_labels.at(size - 1);
        QPDFObjectHandle last_idx = new_labels.at(size - 2);
        if (last_idx.isInteger() && last.isDictionary() &&
            (label.getKey("/S").unparse() == last.getKey("/S").unparse()) &&
            (label.getKey("/P").unparse() == last.getKey("/P").unparse()) &&
            label.getKey("/St").isInteger() && last.getKey("/St").isInteger()) {
            long long int st_delta =
                label.getKey("/St").getIntValue() - last.getKey("/St").getIntValue();
            long long int idx_delta = new_start_idx - last_idx.getIntValue();
            if (st_delta == idx_delta) {
                QTC::TC("qpdf", "QPDFPageLabelDocumentHelper skip first");
                skip_first = true;
            }
        }
    }
    if (!skip_first) {
        new_labels.push_back(QPDFObjectHandle::newInteger(new_start_idx));
        new_labels.push_back(label);
    }

    long long int idx_offset = new_start_idx - start_idx;
    for (long long i = start_idx + 1; i <= end_idx; ++i) {
        if (m->labels->hasIndex(i) && (label = getLabelForPage(i)).isDictionary()) {
            new_labels.push_back(QPDFObjectHandle::newInteger(i + idx_offset));
            new_labels.push_back(label);
        }
    }
}